

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPackedMipTailStartLod(GmmResourceInfoCommon *this)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  GMM_PLATFORM_INFO *pGVar3;
  undefined4 local_30;
  int local_2c;
  uint32_t NumTilesForPackedMips;
  uint32_t NumPackedMips;
  
  local_2c = 0;
  local_30 = 0;
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pGVar3 = GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar1));
  (*this->_vptr_GmmResourceInfoCommon[0x11])(this,&local_2c,&local_30);
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])(this);
  if (iVar1 == 0) {
    uVar2 = pGVar3->MaxLod;
  }
  else {
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])(this);
    uVar2 = (iVar1 + 1) - local_2c;
  }
  return uVar2;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPackedMipTailStartLod()

{
    uint32_t NumPackedMips = 0, NumTilesForPackedMips = 0;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());

    GetTiledResourceMipPacking(&NumPackedMips,
                               &NumTilesForPackedMips);

    return (GetMaxLod() == 0) ?
           pPlatform->MaxLod :
           GetMaxLod() - NumPackedMips + 1; //GetMaxLod srarts at index 0, while NumPackedMips is just
                                            //the number of mips. So + 1 to bring them to same units.
}